

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_text.c
# Opt level: O2

int log_policy_format_text_create(log_policy policy,log_policy_ctor ctor)

{
  undefined4 *instance;
  
  instance = (undefined4 *)malloc(4);
  if (instance != (undefined4 *)0x0) {
    *instance = *ctor;
    log_policy_instantiate(policy,instance,1);
  }
  return (uint)(instance == (undefined4 *)0x0);
}

Assistant:

static int log_policy_format_text_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_format_text_data text_data = malloc(sizeof(struct log_policy_format_text_data_type));

	const log_policy_format_text_ctor text_ctor = ctor;

	if (text_data == NULL)
	{
		return 1;
	}

	if (text_ctor != NULL)
	{
		text_data->flags = text_ctor->flags;
	}
	else
	{
		text_data->flags = LOG_POLICY_FORMAT_TEXT_EMPTY;
	}

	text_data->flags = text_ctor->flags;

	log_policy_instantiate(policy, text_data, LOG_POLICY_FORMAT_TEXT);

	return 0;
}